

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

xmlChar * xmlStrstr(xmlChar *str,xmlChar *val)

{
  int len;
  int iVar1;
  
  if (val != (xmlChar *)0x0 && str != (xmlChar *)0x0) {
    len = xmlStrlen(val);
    if (len == 0) {
      return str;
    }
    for (; *str != '\0'; str = str + 1) {
      if ((*str == *val) && (iVar1 = xmlStrncmp(str,val,len), iVar1 == 0)) {
        return str;
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlStrstr(const xmlChar *str, const xmlChar *val) {
    int n;

    if (str == NULL) return(NULL);
    if (val == NULL) return(NULL);
    n = xmlStrlen(val);

    if (n == 0) return(str);
    while (*str != 0) { /* non input consuming */
        if (*str == *val) {
            if (!xmlStrncmp(str, val, n)) return((const xmlChar *) str);
        }
        str++;
    }
    return(NULL);
}